

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::rehash
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this)

{
  uint uVar1;
  uint *puVar2;
  Allocator *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  uint *puVar5;
  ulong uVar6;
  uint *item;
  
  uVar1 = this->bucketCount;
  uVar6 = (ulong)uVar1;
  puVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    puVar5 = (uint *)(*(code *)NULLC::alloc)(uVar1 * 8);
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])();
    puVar5 = (uint *)CONCAT44(extraout_var,iVar4);
  }
  this->data = puVar5;
  NULLC::fillMemory(puVar5,0,(ulong)this->bucketCount << 2);
  this->count = 0;
  puVar5 = puVar2;
  for (; uVar6 != 0; uVar6 = uVar6 - 1) {
    if (*puVar5 != 0) {
      insert(this,puVar5);
    }
    puVar5 = puVar5 + 1;
  }
  if (puVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 != (Allocator *)0x0) {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,puVar2);
      return;
    }
    (*(code *)NULLC::dealloc)(puVar2);
    return;
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}